

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O3

void copy_suite::partition_copy(void)

{
  int iVar1;
  ulong uVar2;
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  bool bVar3;
  byte *pbVar4;
  reference piVar5;
  reference piVar6;
  ulong uVar7;
  circular_view<int,_18446744073709551615UL> *this;
  initializer_list<int> input;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> no_copy;
  circular_view<int,_18446744073709551615UL> yes_copy;
  int no_copy_array [4];
  int yes_copy_array [4];
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  allocator_type local_111;
  vector<int,_std::allocator<int>_> local_110;
  circular_view<int,_18446744073709551615UL> local_f8;
  iterator_type local_d8;
  view_pointer local_c8;
  size_type sStack_c0;
  view_pointer local_b8;
  size_type sStack_b0;
  circular_view<int,_18446744073709551615UL> local_a8;
  type local_88 [4];
  type local_78 [4];
  type local_68 [6];
  circular_view<int,_18446744073709551615UL> local_50;
  
  local_50.member.data = local_68;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_50.member.cap = 4;
  local_50.member.size = 0;
  local_50.member.next = 4;
  local_a8.member.data = (pointer)0x160000000b;
  local_a8.member.cap = 0x2c00000021;
  local_a8.member.size = CONCAT44(local_a8.member.size._4_4_,0x37);
  input._M_len = 5;
  input._M_array = (iterator)&local_a8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_50,input);
  local_a8.member.data = local_78;
  local_a8.member.cap = 4;
  local_a8.member.size = 0;
  local_a8.member.next = 4;
  local_f8.member.data = local_88;
  local_f8.member.cap = 4;
  local_f8.member.size = 0;
  local_f8.member.next = 4;
  local_d8.current = local_50.member.cap * 2;
  if ((local_d8.current & local_50.member.cap * 2 - 1) == 0) {
    local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)(local_50.member.next - local_50.member.size & local_d8.current - 1);
    local_d8.current = local_d8.current - 1 & local_50.member.next;
  }
  else {
    local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((local_50.member.next - local_50.member.size) % local_d8.current);
    local_d8.current = local_50.member.next % local_d8.current;
  }
  local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_50;
  local_d8.parent = &local_50;
  bVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    ((basic_iterator<int> *)&local_110,&local_d8);
  if (!bVar3) {
    do {
      pbVar4 = (byte *)vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::
                       operator*((basic_iterator<int> *)&local_110);
      this = &local_f8;
      if ((*pbVar4 & 1) == 0) {
        this = &local_a8;
      }
      piVar5 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         ((basic_iterator<int> *)&local_110);
      iVar1 = *piVar5;
      vista::circular_view<int,_18446744073709551615UL>::expand_back(this,1);
      piVar6 = vista::circular_view<int,_18446744073709551615UL>::back(this);
      *piVar6 = iVar1;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
                ((basic_iterator<int> *)&local_110);
      bVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                        ((basic_iterator<int> *)&local_110,&local_d8);
    } while (!bVar3);
  }
  local_d8.parent = (view_pointer)0x2c00000016;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_d8;
  std::vector<int,_std::allocator<int>_>::vector(&local_110,__l,&local_111);
  uVar2 = local_a8.member.cap * 2;
  if ((uVar2 & local_a8.member.cap * 2 - 1) == 0) {
    uVar7 = local_a8.member.next - local_a8.member.size & uVar2 - 1;
    sStack_b0 = uVar2 - 1 & local_a8.member.next;
  }
  else {
    uVar7 = (local_a8.member.next - local_a8.member.size) % uVar2;
    sStack_b0 = local_a8.member.next % uVar2;
  }
  first_end.current = sStack_b0;
  first_end.parent = &local_a8;
  first_begin.current = uVar7;
  first_begin.parent = &local_a8;
  local_b8 = &local_a8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x88,"void copy_suite::partition_copy()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if ((view_pointer)
      local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_d8.parent = (view_pointer)0x3700000021;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_d8;
  std::vector<int,_std::allocator<int>_>::vector(&local_110,__l_00,&local_111);
  uVar2 = local_f8.member.cap * 2;
  if ((uVar2 & local_f8.member.cap * 2 - 1) == 0) {
    uVar7 = local_f8.member.next - local_f8.member.size & uVar2 - 1;
    sStack_c0 = uVar2 - 1 & local_f8.member.next;
  }
  else {
    uVar7 = (local_f8.member.next - local_f8.member.size) % uVar2;
    sStack_c0 = local_f8.member.next % uVar2;
  }
  local_c8 = &local_f8;
  first_end_00.current = sStack_c0;
  first_end_00.parent = local_c8;
  first_begin_00.current = uVar7;
  first_begin_00.parent = local_c8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x8d,"void copy_suite::partition_copy()",first_begin_00,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if ((view_pointer)
      local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void partition_copy()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44, 55 };
    int yes_copy_array[4];
    circular_view<int> yes_copy(yes_copy_array);
    int no_copy_array[4];
    circular_view<int> no_copy(no_copy_array);
    std::partition_copy(span.begin(), span.end(), std::back_inserter(yes_copy), std::back_inserter(no_copy), [](int value) { return value % 2 == 0; });
    {
        std::vector<int> expect = { 22, 44 };
        BOOST_TEST_ALL_EQ(yes_copy.begin(), yes_copy.end(),
                          expect.begin(), expect.end());
    }
    {
        std::vector<int> expect = { 33, 55 };
        BOOST_TEST_ALL_EQ(no_copy.begin(), no_copy.end(),
                          expect.begin(), expect.end());
    }
}